

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_cs.cpp
# Opt level: O2

CallResultWrap * tapi_query_trades(void *h,char *account_id,char *codes)

{
  Trade *pTVar1;
  vector<TradeWrap*,std::allocator<TradeWrap*>> *this;
  void *pvVar2;
  CallResultWrap *this_00;
  TradeWrap *this_01;
  char *pcVar3;
  Trade *trade;
  shared_ptr<_WrapArray<TradeWrap>_> *this_02;
  CallResult<const_std::vector<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>_> r;
  allocator local_aa;
  allocator local_a9;
  CallResultWrap *local_a8;
  __shared_ptr<_WrapArray<TradeWrap>,_(__gnu_cxx::_Lock_policy)2> local_a0 [2];
  string local_80 [32];
  CallResult<const_std::vector<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>_> local_60;
  
  if (h != (void *)0x0) {
    std::__cxx11::string::string((string *)local_a0,account_id,&local_a9);
    std::__cxx11::string::string(local_80,codes,&local_aa);
    (**(code **)(*h + 0x38))(&local_60,h,local_a0,local_80);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string((string *)local_a0);
    this_00 = (CallResultWrap *)operator_new(0x10c);
    CallResultWrap::CallResultWrap(this_00);
    if (local_60.value.
        super___shared_ptr<const_std::vector<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      pcVar3 = _T(&local_60.msg,&this_00->_msg);
      this_00->msg = pcVar3;
    }
    else {
      local_a8 = this_00;
      std::make_shared<_WrapArray<TradeWrap>>();
      this_02 = &local_a8->trades;
      std::__shared_ptr<_WrapArray<TradeWrap>,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&this_02->super___shared_ptr<_WrapArray<TradeWrap>,_(__gnu_cxx::_Lock_policy)2>,
                 local_a0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0[0]._M_refcount);
      pTVar1 = ((local_60.value.
                 super___shared_ptr<const_std::vector<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->
               super__Vector_base<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (trade = ((local_60.value.
                     super___shared_ptr<const_std::vector<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->
                   super__Vector_base<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          this = (vector<TradeWrap*,std::allocator<TradeWrap*>> *)
                 (this_02->super___shared_ptr<_WrapArray<TradeWrap>,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr, trade != pTVar1; trade = trade + 1) {
        this_01 = (TradeWrap *)operator_new(0x10c);
        TradeWrap::TradeWrap(this_01,trade);
        local_a0[0]._M_ptr = (element_type *)this_01;
        std::vector<TradeWrap*,std::allocator<TradeWrap*>>::emplace_back<TradeWrap*>
                  (this,(TradeWrap **)local_a0);
      }
      pvVar2 = *(void **)this;
      local_a8->value = pvVar2;
      local_a8->element_size = 0x10c;
      local_a8->element_count = (int32_t)((ulong)(*(long *)(this + 8) - (long)pvVar2) >> 3);
      local_a8->value_type = 9;
      this_00 = local_a8;
    }
    tquant::api::
    CallResult<const_std::vector<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>_>::
    ~CallResult(&local_60);
    return this_00;
  }
  __assert_fail("tapi",
                "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/c/api/tqapi_cs.cpp"
                ,0x154,"CallResultWrap *tapi_query_trades(void *, const char *, const char *)");
}

Assistant:

_TQAPI_EXPORT
CallResultWrap* tapi_query_trades(void* h, const char* account_id, const char* codes)
{
    auto tapi = reinterpret_cast<TradeApi*>(h);
    assert(tapi);

    auto r = tapi->query_trades(account_id, codes);
    CallResultWrap* cr = new CallResultWrap();
    if (r.value) {
		cr->trades = make_shared<TradeWrapArray>();
        for (auto& tmp : *r.value)
            cr->trades->wraps.push_back(new TradeWrap(&tmp));

        cr->value = reinterpret_cast<const void*>(cr->trades->wraps.data());
        cr->element_size = sizeof(TradeWrap);
        cr->element_count = (int32_t)cr->trades->wraps.size();
        cr->value_type = VT_TRADE_ARRAY;
    }
    else {
		cr->msg = _T(r.msg, cr->_msg);
    }
    return cr;
}